

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O1

void test_read_uint32_iterator(uint8_t type)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  roaring_bitmap_t *r;
  roaring_uint32_iterator_t *it;
  ulong uVar3;
  uint32_t *ref_values;
  uint32_t buffer [1];
  uint32_t ref_count;
  uint32_t *local_38;
  uint32_t local_30;
  uint local_2c;
  
  test_iterator_generate_data(&local_38,&local_2c);
  r = roaring_bitmap_create_with_capacity(0);
  puVar1 = local_38;
  if ((ulong)local_2c != 0) {
    uVar3 = 0;
    do {
      roaring_bitmap_add(r,puVar1[uVar3]);
      uVar3 = uVar3 + 1;
    } while (local_2c != uVar3);
  }
  if (type != 0xff) {
    convert_all_containers(r,type);
  }
  it = roaring_iterator_create(r);
  uVar2 = roaring_uint32_iterator_read(it,&local_30,0);
  _assert_true((ulong)(uVar2 == 0),"got == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xf9b);
  _assert_true((ulong)it->has_value,"iter->has_value",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xf9c);
  _assert_true((ulong)(it->current_value == 0),"iter->current_value == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/toplevel_unit.c"
               ,0xf9d);
  roaring_uint32_iterator_free(it);
  read_compare(r,local_38,local_2c,1);
  read_compare(r,local_38,local_2c,2);
  read_compare(r,local_38,local_2c,7);
  read_compare(r,local_38,local_2c,local_2c - 1);
  read_compare(r,local_38,local_2c,local_2c);
  read_compare(r,local_38,local_2c,0xffffffff);
  roaring_bitmap_free(r);
  free(local_38);
  return;
}

Assistant:

void test_read_uint32_iterator(uint8_t type) {
    uint32_t *ref_values;
    uint32_t ref_count;
    test_iterator_generate_data(&ref_values, &ref_count);

    roaring_bitmap_t *r = roaring_bitmap_create();
    for (uint32_t i = 0; i < ref_count; i++) {
        roaring_bitmap_add(r, ref_values[i]);
    }
    if (type != UINT8_MAX) {
        convert_all_containers(r, type);
    }

    roaring_uint32_iterator_t *iter = roaring_iterator_create(r);
    uint32_t buffer[1];
    uint32_t got = roaring_uint32_iterator_read(iter, buffer, 0);
    assert_true(got == 0);
    assert_true(iter->has_value);
    assert_true(iter->current_value == 0);
    roaring_uint32_iterator_free(iter);

    read_compare(r, ref_values, ref_count, 1);
    read_compare(r, ref_values, ref_count, 2);
    read_compare(r, ref_values, ref_count, 7);
    read_compare(r, ref_values, ref_count, ref_count - 1);
    read_compare(r, ref_values, ref_count, ref_count);
    read_compare(r, ref_values, ref_count, UINT32_MAX);  // special value

    roaring_bitmap_free(r);
    free(ref_values);
}